

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O0

void __thiscall
TEST_TestMemoryAccountant_reportWithCacheSizes_TestShell::
~TEST_TestMemoryAccountant_reportWithCacheSizes_TestShell
          (TEST_TestMemoryAccountant_reportWithCacheSizes_TestShell *this)

{
  TEST_TestMemoryAccountant_reportWithCacheSizes_TestShell *this_local;
  
  ~TEST_TestMemoryAccountant_reportWithCacheSizes_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(TestMemoryAccountant, reportWithCacheSizes)
{
    size_t cacheSizes[] = {4};

    accountant.useCacheSizes(cacheSizes, 1);
    accountant.dealloc(8);
    accountant.dealloc(12);
    accountant.dealloc(20);

    accountant.alloc(4);
    accountant.dealloc(4);
    accountant.alloc(4);
    STRCMP_EQUAL("CppUTest Memory Accountant report (with cache sizes):\n"
                 "Cache size          # allocations    # deallocations   max # allocations at one time\n"
                 "    4                   2                1                 1\n"
                 "other                   0                3                 0\n"
                 "   Thank you for your business\n"
                 , accountant.report().asCharString());
}